

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

void __thiscall glslang::TShader::~TShader(TShader *this)

{
  TInfoSink *pTVar1;
  pointer pcVar2;
  TIntermediate *this_00;
  TPoolAllocator *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_TShader = (_func_int **)&PTR__TShader_00923008;
  pTVar1 = this->infoSink;
  if (pTVar1 != (TInfoSink *)0x0) {
    pcVar2 = (pTVar1->debug).sink._M_dataplus._M_p;
    paVar3 = &(pTVar1->debug).sink.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
    pcVar2 = (pTVar1->info).sink._M_dataplus._M_p;
    paVar3 = &(pTVar1->info).sink.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pTVar1,0x60);
  if (this->compiler != (TCompiler *)0x0) {
    (*(this->compiler->super_TShHandleBase)._vptr_TShHandleBase[1])();
  }
  this_00 = this->intermediate;
  if (this_00 != (TIntermediate *)0x0) {
    TIntermediate::~TIntermediate(this_00);
  }
  operator_delete(this_00,0x7e8);
  this_01 = this->pool;
  if (this_01 != (TPoolAllocator *)0x0) {
    TPoolAllocator::~TPoolAllocator(this_01);
  }
  operator_delete(this_01,0x60);
  pcVar2 = (this->sourceEntryPointName)._M_dataplus._M_p;
  paVar3 = &(this->sourceEntryPointName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TShader::~TShader()
{
    delete infoSink;
    delete compiler;
    delete intermediate;
    delete pool;
}